

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_ObjSetCuts(Kf_Man_t *p,int i,Vec_Int_t *vVec)

{
  int *piVar1;
  int iVar2;
  int *__src;
  word **__ptr;
  word *pwVar3;
  int iVar4;
  word wVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  iVar2 = vVec->nSize;
  iVar6 = iVar2 + 1 >> 1;
  iVar9 = 1 << ((byte)(p->pMem).nPageSize & 0x1f);
  if (iVar9 <= iVar6) {
    __assert_fail("nWords < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecSet.h"
                  ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
  }
  __src = vVec->pArray;
  piVar1 = &(p->pMem).nEntries;
  *piVar1 = *piVar1 + 1;
  __ptr = (p->pMem).pPages;
  iVar7 = (p->pMem).iPage;
  pwVar3 = __ptr[iVar7];
  iVar4 = (int)*pwVar3;
  if (iVar9 <= iVar6 + iVar4) {
    uVar8 = (long)iVar7 + 1;
    (p->pMem).iPage = (int)uVar8;
    if ((int)uVar8 == (p->pMem).nPagesAlloc) {
      __ptr = (word **)realloc(__ptr,uVar8 * 0x10);
      (p->pMem).pPages = __ptr;
      iVar9 = (p->pMem).nPagesAlloc;
      memset(__ptr + iVar9,0,(long)iVar9 << 3);
      (p->pMem).nPagesAlloc = iVar9 * 2;
      uVar8 = (ulong)(uint)(p->pMem).iPage;
    }
    iVar7 = (int)uVar8;
    pwVar3 = __ptr[iVar7];
    if (pwVar3 == (word *)0x0) {
      pwVar3 = (word *)malloc((0x100000000 << ((byte)(p->pMem).nPageSize & 0x3f)) >> 0x1d);
      __ptr[iVar7] = pwVar3;
      __ptr = (p->pMem).pPages;
      pwVar3 = __ptr[iVar7];
    }
    *pwVar3 = 2;
    pwVar3[1] = 0xffffffffffffffff;
    iVar4 = 2;
  }
  if (__src != (int *)0x0) {
    memcpy(pwVar3 + iVar4,__src,(long)iVar2 << 2);
    __ptr = (p->pMem).pPages;
    iVar7 = (p->pMem).iPage;
  }
  wVar5 = (long)iVar6 + *__ptr[iVar7];
  *__ptr[iVar7] = wVar5;
  Vec_IntWriteEntry(&p->vCuts,i,((int)wVar5 - iVar6) + (iVar7 << ((byte)(p->pMem).nPageSize & 0x1f))
                   );
  return;
}

Assistant:

static inline void  Kf_ObjSetCuts( Kf_Man_t * p, int i, Vec_Int_t * vVec ) { Vec_IntWriteEntry(&p->vCuts, i, Vec_SetAppend(&p->pMem, Vec_IntArray(vVec), Vec_IntSize(vVec)));  }